

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.h
# Opt level: O0

SEARCH_METHODS av1_get_faster_search_method(SEARCH_METHODS search_method)

{
  SEARCH_METHODS search_method_local;
  SEARCH_METHODS local_1;
  
  switch(search_method) {
  case '\0':
    local_1 = '\x05';
    break;
  case '\x01':
    local_1 = '\0';
    break;
  case '\x02':
    local_1 = '\0';
    break;
  case '\x03':
    local_1 = '\x05';
    break;
  case '\x04':
    local_1 = '\a';
    break;
  case '\x05':
    local_1 = '\x04';
    break;
  case '\x06':
    local_1 = '\x04';
    break;
  case '\a':
    local_1 = '\a';
    break;
  case '\b':
    local_1 = '\n';
    break;
  case '\t':
    local_1 = '\t';
    break;
  case '\n':
    local_1 = '\n';
    break;
  default:
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static inline SEARCH_METHODS av1_get_faster_search_method(
    SEARCH_METHODS search_method) {
  // Note on search method's accuracy:
  //  1. NSTEP
  //  2. DIAMOND
  //  3. BIGDIA \approx SQUARE
  //  4. HEX.
  //  5. FAST_HEX \approx FAST_DIAMOND
  switch (search_method) {
    case NSTEP: return DIAMOND;
    case NSTEP_8PT: return DIAMOND;
    case DIAMOND: return BIGDIA;
    case CLAMPED_DIAMOND: return BIGDIA;
    case BIGDIA: return HEX;
    case SQUARE: return HEX;
    case HEX: return FAST_HEX;
    case FAST_HEX: return FAST_HEX;
    case FAST_DIAMOND: return VFAST_DIAMOND;
    case FAST_BIGDIA: return FAST_BIGDIA;
    case VFAST_DIAMOND: return VFAST_DIAMOND;
    default: assert(0 && "Invalid search method!"); return DIAMOND;
  }
}